

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_CheckButcherTables(ARKodeMem ark_mem)

{
  double *pdVar1;
  void *pvVar2;
  bool bVar3;
  ARKodeMem in_RDI;
  sunrealtype tol;
  ARKodeARKStepMem step_mem;
  int okay;
  int j;
  int i;
  int local_18;
  int local_14;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x917,"arkStep_CheckButcherTables",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    pvVar2 = in_RDI->step_mem;
    if ((*(int *)((long)pvVar2 + 0x1c) == 0) || (*(long *)((long)pvVar2 + 0x68) != 0)) {
      if ((*(int *)((long)pvVar2 + 0x20) == 0) || (*(long *)((long)pvVar2 + 0x70) != 0)) {
        if (*(int *)((long)pvVar2 + 100) < 1) {
          arkProcessError(in_RDI,-0x29,0x92f,"arkStep_CheckButcherTables",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"stages < 1!");
          local_4 = -0x29;
        }
        else if (*(int *)((long)pvVar2 + 0x58) < 1) {
          arkProcessError(in_RDI,-0x29,0x937,"arkStep_CheckButcherTables",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"method order < 1!");
          local_4 = -0x29;
        }
        else if ((*(int *)((long)pvVar2 + 0x5c) < 1) && (in_RDI->fixedstep == 0)) {
          arkProcessError(in_RDI,-0x29,0x93f,"arkStep_CheckButcherTables",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"embedding order < 1!");
          local_4 = -0x29;
        }
        else {
          if ((0 < *(int *)((long)pvVar2 + 0x5c)) && (in_RDI->fixedstep == 0)) {
            if ((*(int *)((long)pvVar2 + 0x20) != 0) &&
               (*(long *)(*(long *)((long)pvVar2 + 0x70) + 0x28) == 0)) {
              arkProcessError(in_RDI,-0x29,0x94b,"arkStep_CheckButcherTables",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"no implicit embedding!");
              return -0x29;
            }
            if ((*(int *)((long)pvVar2 + 0x1c) != 0) &&
               (*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x28) == 0)) {
              arkProcessError(in_RDI,-0x29,0x954,"arkStep_CheckButcherTables",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"no explicit embedding!");
              return -0x29;
            }
          }
          if (*(int *)((long)pvVar2 + 0x1c) != 0) {
            bVar3 = true;
            for (local_14 = 0; local_14 < *(int *)((long)pvVar2 + 100); local_14 = local_14 + 1) {
              for (local_18 = local_14; local_18 < *(int *)((long)pvVar2 + 100);
                  local_18 = local_18 + 1) {
                if (2.220446049250313e-14 <
                    ABS(*(double *)
                         (*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x10) +
                                   (long)local_14 * 8) + (long)local_18 * 8))) {
                  bVar3 = false;
                }
              }
            }
            if (!bVar3) {
              arkProcessError(in_RDI,-0x29,0x968,"arkStep_CheckButcherTables",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"Ae Butcher table is implicit!");
              return -0x29;
            }
          }
          if (*(int *)((long)pvVar2 + 0x20) != 0) {
            bVar3 = false;
            for (local_14 = 0; local_14 < *(int *)((long)pvVar2 + 100); local_14 = local_14 + 1) {
              if (2.220446049250313e-14 <
                  ABS(*(double *)
                       (*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x70) + 0x10) +
                                 (long)local_14 * 8) + (long)local_14 * 8))) {
                bVar3 = true;
              }
            }
            if (!bVar3) {
              arkProcessError(in_RDI,-0x29,0x978,"arkStep_CheckButcherTables",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"Ai Butcher table is explicit!");
              return -0x29;
            }
            bVar3 = true;
            for (local_14 = 0; local_18 = local_14, local_14 < *(int *)((long)pvVar2 + 100);
                local_14 = local_14 + 1) {
              while (local_18 = local_18 + 1, local_18 < *(int *)((long)pvVar2 + 100)) {
                if (2.220446049250313e-14 <
                    ABS(*(double *)
                         (*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x70) + 0x10) +
                                   (long)local_14 * 8) + (long)local_18 * 8))) {
                  bVar3 = false;
                }
              }
            }
            if (!bVar3) {
              arkProcessError(in_RDI,-0x29,0x987,"arkStep_CheckButcherTables",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"Ai Butcher table has entries above diagonal!");
              return -0x29;
            }
          }
          if (in_RDI->relax_enabled != 0) {
            if (*(int *)((long)pvVar2 + 0x58) < 2) {
              arkProcessError(in_RDI,-0x29,0x992,"arkStep_CheckButcherTables",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"The Butcher table(s) must be at least second order!");
              return -0x29;
            }
            if (*(int *)((long)pvVar2 + 0x1c) != 0) {
              for (local_14 = 0; local_14 < *(int *)((long)pvVar2 + 100); local_14 = local_14 + 1) {
                pdVar1 = (double *)
                         (*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x20) + (long)local_14 * 8);
                if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
                  arkProcessError(in_RDI,-0x29,0x99e,"arkStep_CheckButcherTables",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                                  ,"The explicit Butcher table has a negative b value!");
                  return -0x29;
                }
              }
            }
            if (*(int *)((long)pvVar2 + 0x20) != 0) {
              for (local_14 = 0; local_14 < *(int *)((long)pvVar2 + 100); local_14 = local_14 + 1) {
                pdVar1 = (double *)
                         (*(long *)(*(long *)((long)pvVar2 + 0x70) + 0x20) + (long)local_14 * 8);
                if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
                  arkProcessError(in_RDI,-0x29,0x9ad,"arkStep_CheckButcherTables",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                                  ,"The implicit Butcher table has a negative b value!");
                  return -0x29;
                }
              }
            }
          }
          local_4 = 0;
        }
      }
      else {
        arkProcessError(in_RDI,-0x29,0x927,"arkStep_CheckButcherTables",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                        ,"implicit table is NULL!");
        local_4 = -0x29;
      }
    }
    else {
      arkProcessError(in_RDI,-0x29,0x920,"arkStep_CheckButcherTables",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                      ,"explicit table is NULL!");
      local_4 = -0x29;
    }
  }
  return local_4;
}

Assistant:

int arkStep_CheckButcherTables(ARKodeMem ark_mem)
{
  int i, j;
  sunbooleantype okay;
  ARKodeARKStepMem step_mem;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* check that the expected tables are set */
  if (step_mem->explicit && step_mem->Be == NULL)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "explicit table is NULL!");
    return (ARK_INVALID_TABLE);
  }

  if (step_mem->implicit && step_mem->Bi == NULL)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "implicit table is NULL!");
    return (ARK_INVALID_TABLE);
  }

  /* check that stages > 0 */
  if (step_mem->stages < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "stages < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that method order q > 0 */
  if (step_mem->q < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "method order < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that embedding order p > 0 */
  if ((step_mem->p < 1) && (!ark_mem->fixedstep))
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "embedding order < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that embedding exists */
  if ((step_mem->p > 0) && (!ark_mem->fixedstep))
  {
    if (step_mem->implicit)
    {
      if (step_mem->Bi->d == NULL)
      {
        arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                        __FILE__, "no implicit embedding!");
        return (ARK_INVALID_TABLE);
      }
    }
    if (step_mem->explicit)
    {
      if (step_mem->Be->d == NULL)
      {
        arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                        __FILE__, "no explicit embedding!");
        return (ARK_INVALID_TABLE);
      }
    }
  }

  /* check that ERK table is strictly lower triangular */
  if (step_mem->explicit)
  {
    okay = SUNTRUE;
    for (i = 0; i < step_mem->stages; i++)
    {
      for (j = i; j < step_mem->stages; j++)
      {
        if (SUNRabs(step_mem->Be->A[i][j]) > tol) { okay = SUNFALSE; }
      }
    }
    if (!okay)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Ae Butcher table is implicit!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* check that IRK table is implicit and lower triangular */
  if (step_mem->implicit)
  {
    okay = SUNFALSE;
    for (i = 0; i < step_mem->stages; i++)
    {
      if (SUNRabs(step_mem->Bi->A[i][i]) > tol) { okay = SUNTRUE; }
    }
    if (!okay)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Ai Butcher table is explicit!");
      return (ARK_INVALID_TABLE);
    }

    okay = SUNTRUE;
    for (i = 0; i < step_mem->stages; i++)
    {
      for (j = i + 1; j < step_mem->stages; j++)
      {
        if (SUNRabs(step_mem->Bi->A[i][j]) > tol) { okay = SUNFALSE; }
      }
    }
    if (!okay)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Ai Butcher table has entries above diagonal!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check if the method is compatible with relaxation */
  if (ark_mem->relax_enabled)
  {
    if (step_mem->q < 2)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "The Butcher table(s) must be at least second order!");
      return ARK_INVALID_TABLE;
    }

    if (step_mem->explicit)
    {
      /* Check if all b values are positive */
      for (i = 0; i < step_mem->stages; i++)
      {
        if (step_mem->Be->b[i] < ZERO)
        {
          arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                          __FILE__,
                          "The explicit Butcher table has a negative b value!");
          return ARK_INVALID_TABLE;
        }
      }
    }

    if (step_mem->implicit)
    {
      /* Check if all b values are positive */
      for (i = 0; i < step_mem->stages; i++)
      {
        if (step_mem->Bi->b[i] < ZERO)
        {
          arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                          __FILE__,
                          "The implicit Butcher table has a negative b value!");
          return ARK_INVALID_TABLE;
        }
      }
    }
  }

  return (ARK_SUCCESS);
}